

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  byte object_00;
  char *__s;
  char *__s_00;
  char *__s_01;
  char *__s_02;
  pointer __lhs;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  const_reference pvVar6;
  ulong uVar7;
  size_type sVar8;
  const_reference pvVar9;
  byte *pbVar10;
  const_reference pvVar11;
  const_reference pvVar12;
  char *pcVar13;
  vector<color_t,_std::allocator<color_t>_> *this;
  color_t *data;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  undefined1 local_240 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> out_filename;
  value_type *mask_img;
  value_type *obj_img;
  value_type *obj_img_1;
  int mask;
  value_type *mask_img_1;
  value_type *monster_img;
  int monster_gfx;
  int monster_index;
  value_type object;
  value_type *tile_img;
  int local_1d0;
  int iStack_1cc;
  value_type tile;
  int x;
  int y;
  Image map_image;
  value_type *room;
  int room_index;
  undefined1 local_178 [8];
  vector<monster_t,_std::allocator<monster_t>_> monster_data;
  string local_158;
  undefined1 local_138 [8];
  vector<room_t,_std::allocator<room_t>_> rooms;
  int tile_height;
  int tile_width;
  undefined1 local_f0 [8];
  vector<Image,_std::allocator<Image>_> monster_mask_images;
  string local_d0;
  undefined1 local_b0 [8];
  vector<Image,_std::allocator<Image>_> monster_images;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  vector<Image,_std::allocator<Image>_> tile_images;
  char *out_prefix;
  char *rms_filename;
  char *pymon_dat_filename;
  char *pymask_filename;
  char *pymon_filename;
  char *egapics_filename;
  char **argv_local;
  int argc_local;
  
  if (argc < 7) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar5 = std::operator<<(poVar5,*argv);
    std::operator<<(poVar5," egapics.pic pymon.pic pymask.pic pymon.dat in.rms prefix\n");
    argv_local._4_4_ = 1;
  }
  else {
    pcVar13 = argv[1];
    __s = argv[2];
    __s_00 = argv[3];
    __s_01 = argv[4];
    __s_02 = argv[5];
    tile_images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)argv[6];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar13,&local_81);
    LoadSpritesheet((vector<Image,_std::allocator<Image>_> *)local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,__s,
               (allocator<char> *)
               ((long)&monster_mask_images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    LoadSpritesheet((vector<Image,_std::allocator<Image>_> *)local_b0,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&monster_mask_images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&tile_width,__s_00,(allocator<char> *)((long)&tile_height + 3));
    LoadSpritesheet((vector<Image,_std::allocator<Image>_> *)local_f0,(string *)&tile_width);
    std::__cxx11::string::~string((string *)&tile_width);
    std::allocator<char>::~allocator((allocator<char> *)((long)&tile_height + 3));
    pvVar6 = std::vector<Image,_std::allocator<Image>_>::operator[]
                       ((vector<Image,_std::allocator<Image>_> *)local_60,0);
    iVar1 = Image::GetWidth(pvVar6);
    pvVar6 = std::vector<Image,_std::allocator<Image>_>::operator[]
                       ((vector<Image,_std::allocator<Image>_> *)local_60,0);
    rooms.super__Vector_base<room_t,_std::allocator<room_t>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = Image::GetHeight(pvVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,__s_02,
               (allocator<char> *)
               ((long)&monster_data.super__Vector_base<monster_t,_std::allocator<monster_t>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    LoadRooms((vector<room_t,_std::allocator<room_t>_> *)local_138,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&monster_data.super__Vector_base<monster_t,_std::allocator<monster_t>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&room_index,__s_01,(allocator<char> *)((long)&room + 7));
    LoadMonsterData((vector<monster_t,_std::allocator<monster_t>_> *)local_178,(string *)&room_index
                   );
    std::__cxx11::string::~string((string *)&room_index);
    std::allocator<char>::~allocator((allocator<char> *)((long)&room + 7));
    for (room._0_4_ = 0; uVar7 = (ulong)(int)room,
        sVar8 = std::vector<room_t,_std::allocator<room_t>_>::size
                          ((vector<room_t,_std::allocator<room_t>_> *)local_138), uVar7 < sVar8;
        room._0_4_ = (int)room + 1) {
      map_image.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<room_t,_std::allocator<room_t>_>::operator[]
                              ((vector<room_t,_std::allocator<room_t>_> *)local_138,(long)(int)room)
      ;
      Image::Image((Image *)&x,iVar1 * 0x14,
                   rooms.super__Vector_base<room_t,_std::allocator<room_t>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ << 3);
      for (iStack_1cc = 0;
          __lhs = tile_images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage, iStack_1cc < 8;
          iStack_1cc = iStack_1cc + 1) {
        for (local_1d0 = 0; local_1d0 < 0x14; local_1d0 = local_1d0 + 1) {
          pvVar9 = std::array<unsigned_char,_160UL>::operator[]
                             ((array<unsigned_char,_160UL> *)
                              map_image.pixels_.
                              super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                              (long)(iStack_1cc * 0x14 + local_1d0));
          if (*pvVar9 != '\0') {
            tile_img._7_1_ = *pvVar9 - 1;
            sVar8 = std::vector<Image,_std::allocator<Image>_>::size
                              ((vector<Image,_std::allocator<Image>_> *)local_60);
            if (sVar8 <= tile_img._7_1_) {
              tile_img._7_1_ = 0x14;
            }
            pvVar6 = std::vector<Image,_std::allocator<Image>_>::operator[]
                               ((vector<Image,_std::allocator<Image>_> *)local_60,
                                (ulong)tile_img._7_1_);
            iVar2 = Image::GetWidth(pvVar6);
            iVar3 = Image::GetHeight(pvVar6);
            Image::Blit((Image *)&x,pvVar6,local_1d0 * iVar2,iStack_1cc * iVar3);
            pbVar10 = std::array<unsigned_char,_160UL>::operator[]
                                ((array<unsigned_char,_160UL> *)
                                 &map_image.pixels_.
                                  super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage[0x35].g,
                                 (long)(iStack_1cc * 0x14 + local_1d0));
            object_00 = *pbVar10;
            if (object_00 != 0) {
              if (object_00 < 100) {
                pvVar11 = std::vector<monster_t,_std::allocator<monster_t>_>::operator[]
                                    ((vector<monster_t,_std::allocator<monster_t>_> *)local_178,
                                     (long)(int)(map_image.pixels_.
                                                 super__Vector_base<color_t,_std::allocator<color_t>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 [0x6a].b - 1));
                iVar2 = pvVar11->gfx - 1;
                pvVar6 = std::vector<Image,_std::allocator<Image>_>::operator[]
                                   ((vector<Image,_std::allocator<Image>_> *)local_b0,(long)iVar2);
                pvVar12 = std::vector<Image,_std::allocator<Image>_>::operator[]
                                    ((vector<Image,_std::allocator<Image>_> *)local_f0,(long)iVar2);
                iVar2 = Image::GetWidth(pvVar6);
                iVar3 = Image::GetHeight(pvVar6);
                Image::Blit((Image *)&x,pvVar6,pvVar12,local_1d0 * iVar2,iStack_1cc * iVar3);
              }
              else {
                iVar2 = GetObjectTile(object_00);
                iVar3 = GetObjectTileMask(object_00);
                if (iVar3 == 0) {
                  pvVar6 = std::vector<Image,_std::allocator<Image>_>::operator[]
                                     ((vector<Image,_std::allocator<Image>_> *)local_60,
                                      (ulong)(byte)iVar2);
                  iVar2 = Image::GetWidth(pvVar6);
                  iVar3 = Image::GetHeight(pvVar6);
                  Image::Blit((Image *)&x,pvVar6,local_1d0 * iVar2,iStack_1cc * iVar3);
                }
                else {
                  pvVar6 = std::vector<Image,_std::allocator<Image>_>::operator[]
                                     ((vector<Image,_std::allocator<Image>_> *)local_60,
                                      (ulong)(byte)iVar2);
                  pvVar12 = std::vector<Image,_std::allocator<Image>_>::operator[]
                                      ((vector<Image,_std::allocator<Image>_> *)local_60,(long)iVar3
                                      );
                  out_filename.field_2._8_8_ = pvVar12;
                  iVar2 = Image::GetWidth(pvVar6);
                  iVar3 = Image::GetHeight(pvVar6);
                  Image::Blit((Image *)&x,pvVar6,pvVar12,local_1d0 * iVar2,iStack_1cc * iVar3);
                }
              }
            }
          }
        }
      }
      std::__cxx11::to_string(&local_280,(int)room);
      std::operator+(&local_260,(char *)__lhs,&local_280);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                     &local_260,".png");
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_280);
      pcVar13 = (char *)std::__cxx11::string::c_str();
      iVar2 = Image::GetWidth((Image *)&x);
      iVar3 = Image::GetHeight((Image *)&x);
      this = Image::GetData((Image *)&x);
      data = std::vector<color_t,_std::allocator<color_t>_>::data(this);
      iVar4 = Image::GetWidth((Image *)&x);
      stbi_write_png(pcVar13,iVar2,iVar3,3,data,iVar4 * 3);
      std::__cxx11::string::~string((string *)local_240);
      Image::~Image((Image *)&x);
    }
    argv_local._4_4_ = 0;
    std::vector<monster_t,_std::allocator<monster_t>_>::~vector
              ((vector<monster_t,_std::allocator<monster_t>_> *)local_178);
    std::vector<room_t,_std::allocator<room_t>_>::~vector
              ((vector<room_t,_std::allocator<room_t>_> *)local_138);
    std::vector<Image,_std::allocator<Image>_>::~vector
              ((vector<Image,_std::allocator<Image>_> *)local_f0);
    std::vector<Image,_std::allocator<Image>_>::~vector
              ((vector<Image,_std::allocator<Image>_> *)local_b0);
    std::vector<Image,_std::allocator<Image>_>::~vector
              ((vector<Image,_std::allocator<Image>_> *)local_60);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
  if (argc < 7) {
    std::cerr << "Usage: " << argv[0]
              << " egapics.pic pymon.pic pymask.pic pymon.dat in.rms prefix\n";
    return 1;
  }

  auto const egapics_filename = argv[1];
  auto const pymon_filename = argv[2];
  auto const pymask_filename = argv[3];
  auto const pymon_dat_filename = argv[4];
  auto const rms_filename = argv[5];
  auto const out_prefix = argv[6];

  auto const tile_images = LoadSpritesheet(egapics_filename);
  auto const monster_images = LoadSpritesheet(pymon_filename);
  auto const monster_mask_images = LoadSpritesheet(pymask_filename);
  auto const tile_width = tile_images[0].GetWidth();
  auto const tile_height = tile_images[0].GetHeight();

  auto const rooms = LoadRooms(rms_filename);
  auto const monster_data = LoadMonsterData(pymon_dat_filename);

  for (auto room_index = 0; room_index < rooms.size(); ++room_index) {
    auto const& room = rooms[room_index];
    Image map_image(tile_width * kRoomWidth, tile_height * kRoomHeight);

    // TODO: Cheaters versions of the maps
    // Make glass walls visible
    // No magical darkness
    // Highlight important traps
    // Reveal soft walls and secret doors
    // No fog
    // Easier to see Quasits

    for (auto y = 0; y < kRoomHeight; ++y) {
      for (auto x = 0; x < kRoomWidth; ++x) {
        // FIRST do tile
        auto tile = room.tiles[y * kRoomWidth + x];

        // 0 is null, nothing here
        if (tile == 0) {
          continue;
        }
        tile -= 1;

        // TODO: There are many kinds of traps (wands, XP) but they're stored as
        // ASCII chars. Figure them out
        if (tile >= tile_images.size()) {
          tile = 20;
        }

        auto const& tile_img = tile_images[tile];
        map_image.Blit(tile_img, x * tile_img.GetWidth(),
                       y * tile_img.GetHeight());

        // SECOND do object
        auto object = room.objects[y * kRoomWidth + x];

        // 0 is null, nothing here
        if (object == 0) {
          continue;
        }

        // Monsters (with mask)
        if (object <= 'c') {
          auto const monster_index = room.monster_id - 1;
          auto const monster_gfx = monster_data[monster_index].gfx - 1;
          auto const& monster_img = monster_images[monster_gfx];
          auto const& mask_img = monster_mask_images[monster_gfx];
          map_image.Blit(monster_img, mask_img, x * monster_img.GetWidth(),
                         y * monster_img.GetHeight());
          continue;
        }

        tile = GetObjectTile(object);
        auto mask = GetObjectTileMask(object);

        // Tiles no mask
        if (mask == 0) {
          auto const& obj_img = tile_images[tile];
          map_image.Blit(obj_img, x * obj_img.GetWidth(),
                         y * obj_img.GetHeight());
          continue;
        }

        // Tiles with mask
        auto const& obj_img = tile_images[tile];
        auto const& mask_img = tile_images[mask];
        map_image.Blit(obj_img, mask_img, x * obj_img.GetWidth(),
                       y * obj_img.GetHeight());
      }
    }

    // XXX: I'm relying on color_t to serialize properly without
    // intervention which may not be the case on non-x86 platforms
    auto const out_filename = out_prefix + std::to_string(room_index) + ".png";
    stbi_write_png(out_filename.c_str(), map_image.GetWidth(),
                   map_image.GetHeight(), kImageComponents,
                   map_image.GetData().data(),
                   map_image.GetWidth() * kImageComponents);
  }

  return 0;
}